

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall spirv_cross::SmallVector<Remap,_8UL>::SmallVector(SmallVector<Remap,_8UL> *this)

{
  Remap *pRVar1;
  SmallVector<Remap,_8UL> *this_local;
  
  VectorView<Remap>::VectorView(&this->super_VectorView<Remap>);
  this->buffer_capacity = 0;
  pRVar1 = AlignedBuffer<Remap,_8UL>::data(&this->stack_storage);
  (this->super_VectorView<Remap>).ptr = pRVar1;
  this->buffer_capacity = 8;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}